

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O3

void __thiscall WorldSolver::take_path(WorldSolver *this,WorldPath *path)

{
  pointer ppIVar1;
  Item *pIVar2;
  __normal_iterator<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>
  _Var3;
  Json *this_00;
  reference this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer ppIVar6;
  WorldNode *destination;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  WorldNode *local_38;
  
  local_38 = path->_to_node;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<WorldNode*const*,std::vector<WorldNode*,std::allocator<WorldNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<WorldNode*const>>
                    ((this->_explored_nodes).
                     super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->_explored_nodes).
                     super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var3._M_current ==
      (this->_explored_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<WorldNode*const*,std::vector<WorldNode*,std::allocator<WorldNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<WorldNode*const>>
                      ((this->_nodes_to_explore).
                       super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->_nodes_to_explore).
                       super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_38);
    if (_Var3._M_current ==
        (this->_nodes_to_explore).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<WorldNode*,std::allocator<WorldNode*>>::emplace_back<WorldNode*&>
                ((vector<WorldNode*,std::allocator<WorldNode*>> *)&this->_nodes_to_explore,&local_38
                );
      this_00 = debug_log_for_current_step_abi_cxx11_(this);
      this_01 = nlohmann::
                basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)this_00,"exploration");
      std::operator+(&local_58,"Added ",&local_38->_id);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_58," to accessible nodes");
      local_78._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar5) {
        local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_78.field_2._8_8_ = *(size_type *)((long)&pbVar4->field_2 + 8);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_78._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      nlohmann::
      basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::emplace_back<std::__cxx11::string>
                ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)this_01,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  ppIVar6 = (path->_items_placed_when_crossing).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (path->_items_placed_when_crossing).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar6 != ppIVar1) {
    do {
      pIVar2 = *ppIVar6;
      empty_reachable_item_sources
                ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_58,this);
      local_78._M_string_length = (size_type)local_58._M_dataplus._M_p;
      local_78.field_2._M_allocated_capacity = local_58._M_string_length;
      local_78.field_2._8_8_ = local_58.field_2._M_allocated_capacity;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      local_78._M_dataplus._M_p = (pointer)pIVar2;
      std::
      vector<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>,std::allocator<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>>
      ::emplace_back<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>
                ((vector<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>,std::allocator<std::pair<Item*,std::vector<ItemSource*,std::allocator<ItemSource*>>>>>
                  *)&this->_scheduled_item_placements,
                 (pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_> *)
                 &local_78);
      if ((pointer)local_78._M_string_length != (pointer)0x0) {
        operator_delete((void *)local_78._M_string_length,
                        local_78.field_2._8_8_ - local_78._M_string_length);
      }
      if (local_58._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_58._M_dataplus._M_p,
                        local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
      }
      ppIVar6 = ppIVar6 + 1;
    } while (ppIVar6 != ppIVar1);
  }
  return;
}

Assistant:

void WorldSolver::take_path(WorldPath* path)
{
    WorldNode* destination = path->destination();
    if (!vectools::contains(_explored_nodes, destination) && !vectools::contains(_nodes_to_explore, destination))
    {
        _nodes_to_explore.emplace_back(destination);

        Json& debug_log = this->debug_log_for_current_step();
        debug_log["exploration"].emplace_back("Added " + destination->id() + " to accessible nodes");
    }

    for(Item* item : path->items_placed_when_crossing())
    {
        _scheduled_item_placements.emplace_back(std::make_pair(
                item, this->empty_reachable_item_sources()
        ));
    }
}